

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O3

void __thiscall Assimp::Q3BSPFileParser::getTextures(Q3BSPFileParser *this)

{
  Q3BSPModel *pQVar1;
  sQ3BSPTexture *__dest;
  long lVar2;
  ulong uVar3;
  
  pQVar1 = this->m_pModel;
  if (pQVar1 != (Q3BSPModel *)0x0) {
    if ((pQVar1->m_Textures).
        super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pQVar1->m_Textures).
        super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar2 = (long)(pQVar1->m_Lumps).
                    super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]->iOffset;
      uVar3 = 0;
      do {
        __dest = (sQ3BSPTexture *)operator_new(0x48);
        memcpy(__dest,(this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar2,0x48);
        (pQVar1->m_Textures).
        super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar3] = __dest;
        lVar2 = lVar2 + 0x48;
        uVar3 = uVar3 + 1;
        pQVar1 = this->m_pModel;
      } while (uVar3 < (ulong)((long)(pQVar1->m_Textures).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pQVar1->m_Textures).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xe9,"void Assimp::Q3BSPFileParser::getTextures()");
}

Assistant:

void Q3BSPFileParser::getTextures()
{
    ai_assert(nullptr != m_pModel );

    size_t Offset = m_pModel->m_Lumps[ kTextures ]->iOffset;
    for ( size_t idx=0; idx < m_pModel->m_Textures.size(); idx++ )
    {
        sQ3BSPTexture *pTexture = new sQ3BSPTexture;
        memcpy( pTexture, &m_Data[ Offset ], sizeof(sQ3BSPTexture) );
        m_pModel->m_Textures[ idx ] = pTexture;
        Offset += sizeof(sQ3BSPTexture);
    }
}